

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O1

IVec4 tcu::getChannelBitDepth(ChannelType channelType)

{
  int i;
  long lVar1;
  uint *in_RDX;
  uint *puVar2;
  undefined4 *in_RDI;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  IVec4 IVar7;
  IVec4 IVar8;
  
  puVar2 = &switchD_019ec00d::switchdataD_01d0cd30;
  switch(channelType) {
  case SNORM_INT8:
    lVar1 = 0;
    do {
      in_RDI[lVar1] = 8;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    break;
  case SNORM_INT16:
    lVar1 = 0;
    do {
      in_RDI[lVar1] = 0x10;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    break;
  case SNORM_INT32:
    lVar1 = 0;
    do {
      in_RDI[lVar1] = 0x20;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    break;
  case UNORM_INT8:
    lVar1 = 0;
    do {
      in_RDI[lVar1] = 8;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    break;
  case UNORM_INT16:
    lVar1 = 0;
    do {
      in_RDI[lVar1] = 0x10;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    break;
  case UNORM_INT24:
    lVar1 = 0;
    do {
      in_RDI[lVar1] = 0x18;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    break;
  case UNORM_INT32:
    lVar1 = 0;
    do {
      in_RDI[lVar1] = 0x20;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    break;
  case UNORM_BYTE_44:
  case UNSIGNED_BYTE_44:
    uVar3 = 4;
    uVar4 = 4;
    uVar5 = 0;
    uVar6 = 0;
    goto LAB_019ec23f;
  case UNORM_SHORT_565:
  case UNSIGNED_SHORT_565:
    uVar3 = 5;
    uVar4 = 6;
    uVar5 = 5;
    uVar6 = 0;
    goto LAB_019ec23f;
  case UNORM_SHORT_555:
    uVar3 = 5;
    uVar4 = 5;
    uVar5 = 5;
    uVar6 = 0;
    goto LAB_019ec23f;
  case UNORM_SHORT_4444:
    lVar1 = 0;
    do {
      in_RDI[lVar1] = 4;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    break;
  case UNORM_SHORT_5551:
  case UNSIGNED_SHORT_5551:
    uVar3 = 5;
    uVar4 = 5;
    uVar5 = 5;
    uVar6 = 1;
    goto LAB_019ec23f;
  case UNORM_SHORT_1555:
    uVar3 = 1;
    uVar4 = 5;
    uVar5 = 5;
    uVar6 = 5;
    goto LAB_019ec23f;
  case UNORM_INT_101010:
    uVar3 = 10;
    uVar4 = 10;
    uVar5 = 10;
    uVar6 = 0;
    goto LAB_019ec23f;
  case SNORM_INT_1010102_REV:
  case UNORM_INT_1010102_REV:
  case SIGNED_INT_1010102_REV:
  case UNSIGNED_INT_1010102_REV:
    uVar3 = 10;
    uVar4 = 10;
    uVar5 = 10;
    uVar6 = 2;
    goto LAB_019ec23f;
  case UNSIGNED_SHORT_4444:
    lVar1 = 0;
    do {
      in_RDI[lVar1] = 4;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    break;
  case UNSIGNED_INT_11F_11F_10F_REV:
    uVar3 = 0xb;
    uVar4 = 0xb;
    uVar5 = 10;
    uVar6 = 0;
    goto LAB_019ec23f;
  case UNSIGNED_INT_999_E5_REV:
    uVar3 = 9;
    uVar4 = 9;
    uVar5 = 9;
    uVar6 = 0;
    goto LAB_019ec23f;
  case UNSIGNED_INT_16_8_8:
    uVar3 = 0x10;
    uVar4 = 8;
    uVar5 = 0;
    uVar6 = 0;
    goto LAB_019ec23f;
  case UNSIGNED_INT_24_8:
  case UNSIGNED_INT_24_8_REV:
    uVar3 = 0x18;
    uVar4 = 8;
    uVar5 = 0;
    uVar6 = 0;
    goto LAB_019ec23f;
  case SIGNED_INT8:
    lVar1 = 0;
    do {
      in_RDI[lVar1] = 8;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    break;
  case SIGNED_INT16:
    lVar1 = 0;
    do {
      in_RDI[lVar1] = 0x10;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    break;
  case SIGNED_INT32:
    lVar1 = 0;
    do {
      in_RDI[lVar1] = 0x20;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    break;
  case UNSIGNED_INT8:
    lVar1 = 0;
    do {
      in_RDI[lVar1] = 8;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    break;
  case UNSIGNED_INT16:
    lVar1 = 0;
    do {
      in_RDI[lVar1] = 0x10;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    break;
  case UNSIGNED_INT24:
    lVar1 = 0;
    do {
      in_RDI[lVar1] = 0x18;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    break;
  case UNSIGNED_INT32:
    lVar1 = 0;
    do {
      in_RDI[lVar1] = 0x20;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    break;
  case HALF_FLOAT:
    lVar1 = 0;
    do {
      in_RDI[lVar1] = 0x10;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    break;
  case FLOAT:
    lVar1 = 0;
    do {
      in_RDI[lVar1] = 0x20;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    break;
  case FLOAT64:
    lVar1 = 0;
    do {
      in_RDI[lVar1] = 0x40;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    break;
  case FLOAT_UNSIGNED_INT_24_8_REV:
    uVar3 = 0x20;
    uVar4 = 8;
    uVar5 = 0;
    uVar6 = 0;
    goto LAB_019ec23f;
  default:
    uVar3 = 0;
    uVar4 = 0;
    uVar5 = 0;
    uVar6 = 0;
    puVar2 = in_RDX;
LAB_019ec23f:
    *in_RDI = uVar3;
    in_RDI[1] = uVar4;
    in_RDI[2] = uVar5;
    in_RDI[3] = uVar6;
    IVar8.m_data._8_8_ = puVar2;
    IVar8.m_data._0_8_ = in_RDI;
    return (IVec4)IVar8.m_data;
  }
  IVar7.m_data._8_8_ = &switchD_019ec00d::switchdataD_01d0cd30;
  IVar7.m_data._0_8_ = in_RDI;
  return (IVec4)IVar7.m_data;
}

Assistant:

static IVec4 getChannelBitDepth (TextureFormat::ChannelType channelType)
{
	// make sure this table is updated if format table is updated
	DE_STATIC_ASSERT(TextureFormat::CHANNELTYPE_LAST == 38);

	switch (channelType)
	{
		case TextureFormat::SNORM_INT8:						return IVec4(8);
		case TextureFormat::SNORM_INT16:					return IVec4(16);
		case TextureFormat::SNORM_INT32:					return IVec4(32);
		case TextureFormat::UNORM_INT8:						return IVec4(8);
		case TextureFormat::UNORM_INT16:					return IVec4(16);
		case TextureFormat::UNORM_INT24:					return IVec4(24);
		case TextureFormat::UNORM_INT32:					return IVec4(32);
		case TextureFormat::UNORM_BYTE_44:					return IVec4(4,4,0,0);
		case TextureFormat::UNORM_SHORT_565:				return IVec4(5,6,5,0);
		case TextureFormat::UNORM_SHORT_4444:				return IVec4(4);
		case TextureFormat::UNORM_SHORT_555:				return IVec4(5,5,5,0);
		case TextureFormat::UNORM_SHORT_5551:				return IVec4(5,5,5,1);
		case TextureFormat::UNORM_SHORT_1555:				return IVec4(1,5,5,5);
		case TextureFormat::UNSIGNED_BYTE_44:				return IVec4(4,4,0,0);
		case TextureFormat::UNSIGNED_SHORT_565:				return IVec4(5,6,5,0);
		case TextureFormat::UNSIGNED_SHORT_4444:			return IVec4(4);
		case TextureFormat::UNSIGNED_SHORT_5551:			return IVec4(5,5,5,1);
		case TextureFormat::UNORM_INT_101010:				return IVec4(10,10,10,0);
		case TextureFormat::SNORM_INT_1010102_REV:			return IVec4(10,10,10,2);
		case TextureFormat::UNORM_INT_1010102_REV:			return IVec4(10,10,10,2);
		case TextureFormat::SIGNED_INT8:					return IVec4(8);
		case TextureFormat::SIGNED_INT16:					return IVec4(16);
		case TextureFormat::SIGNED_INT32:					return IVec4(32);
		case TextureFormat::UNSIGNED_INT8:					return IVec4(8);
		case TextureFormat::UNSIGNED_INT16:					return IVec4(16);
		case TextureFormat::UNSIGNED_INT24:					return IVec4(24);
		case TextureFormat::UNSIGNED_INT32:					return IVec4(32);
		case TextureFormat::SIGNED_INT_1010102_REV:			return IVec4(10,10,10,2);
		case TextureFormat::UNSIGNED_INT_1010102_REV:		return IVec4(10,10,10,2);
		case TextureFormat::UNSIGNED_INT_16_8_8:			return IVec4(16,8,0,0);
		case TextureFormat::UNSIGNED_INT_24_8:				return IVec4(24,8,0,0);
		case TextureFormat::UNSIGNED_INT_24_8_REV:			return IVec4(24,8,0,0);
		case TextureFormat::HALF_FLOAT:						return IVec4(16);
		case TextureFormat::FLOAT:							return IVec4(32);
		case TextureFormat::FLOAT64:						return IVec4(64);
		case TextureFormat::UNSIGNED_INT_11F_11F_10F_REV:	return IVec4(11,11,10,0);
		case TextureFormat::UNSIGNED_INT_999_E5_REV:		return IVec4(9,9,9,0);
		case TextureFormat::FLOAT_UNSIGNED_INT_24_8_REV:	return IVec4(32,8,0,0);
		default:
			DE_ASSERT(false);
			return IVec4(0);
	}
}